

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O2

void __thiscall
iDynTree::SixAxisForceTorqueSensor::SixAxisForceTorqueSensor(SixAxisForceTorqueSensor *this)

{
  SixAxisForceTorqueSensorPrivateAttributes *pSVar1;
  
  (this->super_JointSensor).super_Sensor._vptr_Sensor =
       (_func_int **)&PTR__SixAxisForceTorqueSensor_001e68e8;
  pSVar1 = (SixAxisForceTorqueSensorPrivateAttributes *)operator_new(0x160);
  SixAxisForceTorqueSensorPrivateAttributes::SixAxisForceTorqueSensorPrivateAttributes(pSVar1);
  this->pimpl = pSVar1;
  std::__cxx11::string::assign((char *)pSVar1);
  pSVar1 = this->pimpl;
  *(undefined4 *)&pSVar1->link1 = 0xffffffff;
  *(undefined4 *)((long)&pSVar1->link1 + 4) = 0xffffffff;
  *(undefined4 *)&pSVar1->link2 = 0xffffffff;
  *(undefined4 *)((long)&pSVar1->link2 + 4) = 0xffffffff;
  pSVar1->appliedWrenchLink = -1;
  return;
}

Assistant:

SixAxisForceTorqueSensor::SixAxisForceTorqueSensor()
{
    this->pimpl = new SixAxisForceTorqueSensorPrivateAttributes;

    this->pimpl->name = "";
    this->pimpl->link1 = this->pimpl->link2 = this->pimpl->appliedWrenchLink = -1;
}